

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O2

apx_vm_deserializer_t * apx_vm_deserializer_new(void)

{
  apx_error_t aVar1;
  apx_vm_deserializer_t *self;
  
  self = (apx_vm_deserializer_t *)malloc(0x68);
  if (self != (apx_vm_deserializer_t *)0x0) {
    aVar1 = apx_vm_deserializer_create(self);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_vm_deserializer_t *)0x0;
}

Assistant:

apx_vm_deserializer_t* apx_vm_deserializer_new(void)
{
   apx_vm_deserializer_t* self = (apx_vm_deserializer_t*) malloc(sizeof(apx_vm_deserializer_t));
   if (self != NULL)
   {
      apx_error_t rc = apx_vm_deserializer_create(self);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}